

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9ReachP(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  int iVar1;
  uint uVar2;
  int iVar3;
  Aig_Man_t *pAig;
  char *pcVar4;
  char *pcVar5;
  Gia_ParLlb_t Pars;
  char *local_b0;
  Gia_ParLlb_t local_a0;
  
  Llb_ManSetDefaultParams(&local_a0);
  local_b0 = (char *)0x0;
  Extra_UtilGetoptReset();
LAB_00288f62:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"NBFTLrbyzdvwh"), iVar3 = globalUtilOptind,
          0x61 < iVar1) {
      switch(iVar1) {
      case 0x72:
        local_a0.fReorder = local_a0.fReorder ^ 1;
        break;
      case 0x73:
      case 0x74:
      case 0x75:
      case 0x78:
        goto switchD_00288fc0_caseD_73;
      case 0x76:
        local_a0.fVerbose = local_a0.fVerbose ^ 1;
        break;
      case 0x77:
        local_a0.fVeryVerbose = local_a0.fVeryVerbose ^ 1;
        break;
      case 0x79:
        local_a0.fSkipOutCheck = local_a0.fSkipOutCheck ^ 1;
        break;
      case 0x7a:
        local_a0.fSkipReach = local_a0.fSkipReach ^ 1;
        break;
      default:
        if (iVar1 == 0x62) {
          local_a0.fBackward = local_a0.fBackward ^ 1;
        }
        else {
          if (iVar1 != 100) goto switchD_00288fc0_caseD_73;
          local_a0.fDumpReached = local_a0.fDumpReached ^ 1;
        }
      }
    }
    if (iVar1 < 0x4c) {
      if (iVar1 == 0x42) {
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-B\" should be followed by an integer.\n";
          goto LAB_00289121;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_a0.nBddMax = uVar2;
        goto LAB_0028903f;
      }
      if (iVar1 != 0x46) {
        if (iVar1 == -1) {
          p = pAbc->pGia;
          if (p != (Gia_Man_t *)0x0) {
            if (p->nRegs == 0) {
              Abc_Print(-1,"Abc_CommandAbc9ReachP(): The current AIG has no latches.\n");
              return 0;
            }
            if (0xffff < p->nObjs) {
              Abc_Print(-1,
                        "Abc_CommandAbc9ReachP(): Currently cannot handle AIGs with more than %d objects.\n"
                        ,0x10000);
              return 0;
            }
            pAig = Gia_ManToAigSimple(p);
            iVar3 = Llb_ManReachMinCut(pAig,&local_a0);
            pAbc->Status = iVar3;
            pAbc->nFrames = local_a0.iFrame;
            Abc_FrameReplaceCex(pAbc,&pAig->pSeqModel);
            if (local_b0 != (char *)0x0) {
              Abc_NtkWriteLogFile(local_b0,pAbc->pCex,pAbc->Status,pAbc->nFrames,"&reachp");
            }
            Aig_ManStop(pAig);
            return 0;
          }
          pcVar4 = "Abc_CommandAbc9ReachP(): There is no AIG.\n";
          iVar3 = -1;
          goto LAB_002892b1;
        }
        goto switchD_00288fc0_caseD_73;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_00289121;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_a0.nIterMax = uVar2;
    }
    else {
      if (iVar1 == 0x4c) {
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-L\" should be followed by a file name.\n";
LAB_00289121:
          Abc_Print(-1,pcVar4);
          goto switchD_00288fc0_caseD_73;
        }
        local_b0 = argv[globalUtilOptind];
        globalUtilOptind = globalUtilOptind + 1;
        goto LAB_00288f62;
      }
      if (iVar1 == 0x4e) {
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
          goto LAB_00289121;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_a0.nPartValue = uVar2;
      }
      else {
        if (iVar1 != 0x54) goto switchD_00288fc0_caseD_73;
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
          goto LAB_00289121;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_a0.TimeLimit = uVar2;
      }
    }
LAB_0028903f:
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
switchD_00288fc0_caseD_73:
      Abc_Print(-2,"usage: &reachp [-NFT num] [-L file] [-rbyzdvwh]\n");
      Abc_Print(-2,"\t         model checking via BDD-based reachability (partitioning-based)\n");
      Abc_Print(-2,
                "\t-N num : partitioning value (MinVol=nANDs/N/2; MaxVol=nANDs/N) [default = %d]\n",
                (ulong)(uint)local_a0.nPartValue);
      Abc_Print(-2,"\t-F num : max number of reachability iterations [default = %d]\n",
                (ulong)(uint)local_a0.nIterMax);
      Abc_Print(-2,"\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n",
                (ulong)(uint)local_a0.TimeLimit);
      pcVar4 = "no logging";
      if (local_b0 != (char *)0x0) {
        pcVar4 = local_b0;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",pcVar4);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_a0.fReorder == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-r     : enable additional BDD var reordering before image [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (local_a0.fBackward == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-b     : perform backward reachability analysis [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a0.fSkipOutCheck == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-y     : skip checking property outputs [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a0.fSkipReach == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-z     : skip reachability (run preparation phase only) [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (local_a0.fDumpReached == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-d     : dump BDD of reached states into file \"reached.blif\" [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (local_a0.fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar4);
      if (local_a0.fVeryVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-w     : prints additional information [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar3 = -2;
LAB_002892b1:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9ReachP( Abc_Frame_t * pAbc, int argc, char ** argv )
{
//    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Gia_ParLlb_t Pars, * pPars = &Pars;
    Aig_Man_t * pMan;
    char * pLogFileName = NULL;
    int c;
    extern int Llb_ManReachMinCut( Aig_Man_t * pAig, Gia_ParLlb_t * pPars );

    // set defaults
    Llb_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NBFTLrbyzdvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nPartValue = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nPartValue < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBddMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBddMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterMax < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'r':
            pPars->fReorder ^= 1;
            break;
        case 'b':
            pPars->fBackward ^= 1;
            break;
        case 'y':
            pPars->fSkipOutCheck ^= 1;
            break;
        case 'z':
            pPars->fSkipReach ^= 1;
            break;
        case 'd':
            pPars->fDumpReached ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReachP(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReachP(): The current AIG has no latches.\n" );
        return 0;
    }
    if ( Gia_ManObjNum(pAbc->pGia) >= (1<<16) )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReachP(): Currently cannot handle AIGs with more than %d objects.\n", (1<<16) );
        return 0;
    }
    pMan          = Gia_ManToAigSimple( pAbc->pGia );
    pAbc->Status  = Llb_ManReachMinCut( pMan, pPars );
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pMan->pSeqModel );
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "&reachp" );
    Aig_ManStop( pMan );
    return 0;

usage:
    Abc_Print( -2, "usage: &reachp [-NFT num] [-L file] [-rbyzdvwh]\n" );
    Abc_Print( -2, "\t         model checking via BDD-based reachability (partitioning-based)\n" );
    Abc_Print( -2, "\t-N num : partitioning value (MinVol=nANDs/N/2; MaxVol=nANDs/N) [default = %d]\n", pPars->nPartValue );
//    Abc_Print( -2, "\t-B num : the BDD node increase when hints kick in [default = %d]\n", pPars->nBddMax );
    Abc_Print( -2, "\t-F num : max number of reachability iterations [default = %d]\n", pPars->nIterMax );
    Abc_Print( -2, "\t-T num : approximate time limit in seconds (0=infinite) [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n", pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-r     : enable additional BDD var reordering before image [default = %s]\n", pPars->fReorder? "yes": "no" );
    Abc_Print( -2, "\t-b     : perform backward reachability analysis [default = %s]\n", pPars->fBackward? "yes": "no" );
    Abc_Print( -2, "\t-y     : skip checking property outputs [default = %s]\n", pPars->fSkipOutCheck? "yes": "no" );
    Abc_Print( -2, "\t-z     : skip reachability (run preparation phase only) [default = %s]\n", pPars->fSkipReach? "yes": "no" );
    Abc_Print( -2, "\t-d     : dump BDD of reached states into file \"reached.blif\" [default = %s]\n", pPars->fDumpReached? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : prints additional information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}